

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_9xxx_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint local_20;
  uint reg_no;
  int disp8;
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  local_20 = quads[1] << 4 | *quads;
  if ((local_20 & 0x80) != 0) {
    local_20 = local_20 | 0xffffff00;
  }
  sh4asm_txt_movw_a_disp8_pc_rn(em,local_20 * 2 + 4,pc,quads[2]);
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_9xxx_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    // mask is 0xf000
    int disp8 = (quads[1] << 4) | quads[0];
    if (disp8 & (1 << 7))
        disp8 |= ~SH4ASM_BIT_RANGE(0, 7);
    unsigned reg_no = quads[2];
    sh4asm_txt_movw_a_disp8_pc_rn(em, 2 * disp8 + 4, pc, reg_no);
}